

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UtilityTestCase.cpp
# Opt level: O2

void __thiscall
SuiteUtilityTests::TestsocketHostName_SocketNameLocalHost_SocketNameFound::
TestsocketHostName_SocketNameLocalHost_SocketNameFound
          (TestsocketHostName_SocketNameLocalHost_SocketNameFound *this)

{
  UnitTest::Test::Test
            (&this->super_Test,"socketHostName_SocketNameLocalHost_SocketNameFound","UtilityTests",
             "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/test/UtilityTestCase.cpp"
             ,0x9e);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_00321850;
  return;
}

Assistant:

TEST(socketHostName_SocketNameLocalHost_SocketNameFound)
{
  int actualSocket = socket_createConnector();
  socket_setsockopt( actualSocket, TCP_NODELAY );
  std::string address = "127.0.0.1";
  socket_connect( actualSocket, address.c_str(), 1000 );
  std::string local = "localhost";

  CHECK(0 != socket_hostname(local.c_str()));
}